

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

int CoreWvsnprintf(CPalThread *pthrCurrent,LPWSTR Buffer,size_t Count,LPCWSTR Format,
                  __va_list_tag *aparg)

{
  LPCSTR lpMultiByteStr;
  FILE *pFVar1;
  CPalThread *pCVar2;
  uint uVar3;
  WCHAR WVar4;
  BOOL BVar5;
  uint uVar6;
  errno_t eVar7;
  int iVar8;
  DWORD DVar9;
  short *psVar10;
  CPalThread *lpWideCharStr;
  undefined8 *puVar11;
  uint *puVar12;
  ulong uVar13;
  size_t sVar14;
  int *piVar15;
  undefined2 *puVar16;
  int iVar17;
  size_t __maxlen;
  long lVar18;
  uint uVar19;
  size_t _Count;
  long in_FS_OFFSET;
  bool bVar20;
  bool bVar21;
  _func_int **pp_Stack_4d8;
  va_list apcopy;
  int local_4b0;
  int local_4ac;
  INT Prefix;
  LPCWSTR Fmt;
  uint local_498;
  WCHAR TempWChar [2];
  INT Type;
  LPWSTR BufferPtr;
  size_t sStack_480;
  INT Flags;
  LPWSTR local_478;
  CPalThread *local_470;
  CPalThread *local_468;
  int local_460;
  uint local_45c;
  INT Width;
  INT Precision;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  _Prefix = Format;
  _Type = (CPalThread *)Buffer;
  if (!PAL_InitializeChakraCoreCalled) {
LAB_0011c1eb:
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  _Width = *(_func_int ***)aparg;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  iVar17 = (int)Count;
  TempWChar[0] = L'\0';
  TempWChar[1] = L'\0';
  uVar19 = 0;
  sStack_480 = Count;
  local_478 = Buffer;
LAB_0011b739:
  do {
    local_470 = (CPalThread *)((long)_Type - (long)Buffer);
    lVar18 = (long)local_470 >> 1;
    __maxlen = Count - lVar18;
    local_468 = _Type;
    if (0x3fffffff < __maxlen) {
      __maxlen = 0x40000000;
    }
    do {
      WVar4 = *_Prefix;
      if (((WVar4 == L'\0') || (bVar20 = uVar19 != 0, uVar19 = 1, bVar20)) || (iVar17 <= lVar18)) {
        if (lVar18 < iVar17) {
          *(undefined2 *)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset = 0;
        }
        if (uVar19 == 0) {
          iVar17 = (int)((ulong)local_470 >> 1);
          goto LAB_0011c00e;
        }
        piVar15 = __errno_location();
        *piVar15 = 0x22;
        goto LAB_0011bffd;
      }
      if (WVar4 != L'%') {
LAB_0011ba1f:
        _Prefix = _Prefix + 1;
        _Type = (CPalThread *)
                ((long)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset + 2);
        *(WCHAR *)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset = WVar4;
        uVar19 = 0;
        Count = sStack_480;
        Buffer = local_478;
        goto LAB_0011b739;
      }
      BVar5 = Internal_ExtractFormatW
                        (pthrCurrent,(LPCWSTR *)&Prefix,local_438,(LPINT)((long)&BufferPtr + 4),
                         &local_460,(LPINT)&local_45c,&local_4b0,(LPINT)&local_498);
      Buffer = local_478;
      Count = sStack_480;
      iVar8 = local_4b0;
      if (BVar5 == 0) {
        WVar4 = *_Prefix;
        goto LAB_0011ba1f;
      }
      uVar19 = local_498;
      if ((local_4b0 != 4) && (local_4b0 != 2)) {
        bVar20 = local_4b0 == 1;
        if (bVar20 && local_498 == 2) {
          uVar19 = 2;
        }
        else {
          if (local_498 != 3) goto LAB_0011b854;
          uVar19 = 3;
          if ((BufferPtr._4_4_ & 4) == 0) {
LAB_0011b8c6:
            apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
            pp_Stack_4d8 = _Width;
            apcopy[0].gp_offset = ap[0].gp_offset;
            apcopy[0].fp_offset = ap[0].fp_offset;
            uVar6 = vsnprintf((char *)local_468,__maxlen,local_438,&pp_Stack_4d8);
            pthrCurrent = (CPalThread *)&Width;
            PAL_printf_arg_remover((va_list *)pthrCurrent,local_460,local_45c,uVar19,iVar8);
            goto LAB_0011b982;
          }
        }
LAB_0011bb65:
        if (local_460 == -3) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_4ac = -3;
        }
        else {
          local_4ac = local_460;
          if (local_460 == -2) {
            uVar13 = (ulong)_Width & 0xffffffff;
            if (uVar13 < 0x29) {
              _Width = (_func_int **)CONCAT44(Precision,Width + 8);
              piVar15 = (int *)(uVar13 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar15 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_4ac = *piVar15;
            local_460 = local_4ac;
          }
        }
        if (local_45c == 0xfffffffc) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar6 = 0xfffffffc;
        }
        else {
          uVar6 = local_45c;
          if (local_45c == 0xfffffffe) {
            uVar13 = (ulong)_Width & 0xffffffff;
            if (uVar13 < 0x29) {
              _Width = (_func_int **)CONCAT44(Precision,Width + 8);
              puVar12 = (uint *)(uVar13 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar12 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar6 = *puVar12;
            TempWChar[0] = L'\x01';
            TempWChar[1] = L'\0';
            local_45c = uVar6;
          }
        }
        bVar20 = local_4b0 == 2;
        bVar21 = local_4b0 == 4;
        uVar13 = (ulong)_Width & 0xffffffff;
        if (bVar21 || bVar20 && uVar19 == 2) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpWideCharStr = (CPalThread *)*puVar11;
        }
        else {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*puVar11;
          iVar8 = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (iVar8 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x7ae);
            fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
            goto LAB_0011bffd;
          }
          lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((ulong)(iVar8 + 1) * 2);
          if (lpWideCharStr == (CPalThread *)0x0) goto LAB_0011c1db;
          MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)lpWideCharStr,iVar8);
        }
        local_468 = (CPalThread *)CONCAT71(local_468._1_7_,bVar21 || bVar20 && uVar19 == 2);
        if (TempWChar != (WCHAR  [2])0x0) {
          uVar19 = 0;
          uVar3 = 0;
          if ((int)uVar6 < 0) goto LAB_0011be6e;
          goto LAB_0011be4f;
        }
        sVar14 = PAL_wcslen((char16_t *)lpWideCharStr);
        uVar19 = (uint)sVar14;
        goto LAB_0011be6e;
      }
      if ((local_498 & 0xfffffffe) == 2) goto LAB_0011bb65;
      if (local_498 == 1 && local_4b0 == 2) {
        uVar19 = Width;
        if (local_460 + 3U < 2) {
          if ((uint)Width < 0x29) {
            uVar19 = Width + 8;
            _Width = (_func_int **)CONCAT44(Precision,uVar19);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((local_45c & 0xfffffffd) == 0xfffffffc) {
          if (uVar19 < 0x29) {
            uVar19 = uVar19 + 8;
            _Width = (_func_int **)CONCAT44(Precision,uVar19);
            goto LAB_0011bf63;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0011bf84:
          puVar16 = (undefined2 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0011bf63:
          if (0x28 < uVar19) goto LAB_0011bf84;
          _Width = (_func_int **)CONCAT44(Precision,uVar19 + 8);
          puVar16 = (undefined2 *)((ulong)uVar19 + (long)ap[0].overflow_arg_area);
        }
        Fmt._4_2_ = *puVar16;
        Fmt._6_2_ = 0;
        pthrCurrent = (CPalThread *)&Type;
        uVar19 = Internal_AddPaddingW
                           ((LPWSTR *)pthrCurrent,(int)sStack_480 - (int)((ulong)local_470 >> 1),
                            (LPWSTR)((long)&Fmt + 4),local_460 + -1,BufferPtr._4_4_);
        uVar19 = uVar19 ^ 1;
        goto LAB_0011b739;
      }
      bVar20 = false;
LAB_0011b854:
      if (local_498 == 6) {
        if (local_460 == -2) {
          uVar13 = (ulong)_Width & 0xffffffff;
          if (uVar13 < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            piVar15 = (int *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar15 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_460 = *piVar15;
        }
        if (local_45c == 0xfffffffe) {
          uVar13 = (ulong)_Width & 0xffffffff;
          if (uVar13 < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar12 = (uint *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar12 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_45c = *puVar12;
        }
        uVar13 = (ulong)_Width & 0xffffffff;
        if (bVar20) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar11 = (short)((ulong)local_470 >> 1);
        }
        else {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar13 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar11 = (int)((ulong)local_470 >> 1);
        }
        uVar19 = 0;
        goto LAB_0011b739;
      }
      pthrCurrent = local_468;
      if (local_498 != 5 || (bool)(bVar20 ^ 1U)) {
        if (local_498 != 4 || (bool)(bVar20 ^ 1U)) goto LAB_0011b8c6;
        uVar13 = (ulong)_Width & 0xffffffff;
        if (uVar13 < 0x29) {
          _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          psVar10 = (short *)(uVar13 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar10 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uVar6 = snprintf((char *)local_468,__maxlen,local_438,(ulong)(uint)(int)*psVar10);
      }
      else {
        uVar13 = (ulong)_Width & 0xffffffff;
        if (uVar13 < 0x29) {
          _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          psVar10 = (short *)(uVar13 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar10 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uVar6 = snprintf((char *)local_468,__maxlen,local_438,(long)*psVar10);
      }
LAB_0011b982:
      _Count = (size_t)uVar6;
      uVar19 = 0;
    } while (uVar6 == 0);
    if (((int)uVar6 < 0) || (__maxlen <= _Count)) {
      lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc(__maxlen + 1);
      pCVar2 = local_468;
      Buffer = local_478;
      if (lpWideCharStr == (CPalThread *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011c1eb;
        piVar15 = __errno_location();
        *piVar15 = 0xc;
        goto LAB_0011bffd;
      }
      eVar7 = strncpy_s((char *)lpWideCharStr,__maxlen + 1,(char *)local_468,__maxlen);
      if (eVar7 != 0) {
        fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x870);
        fprintf(_stderr,"strncpy_s failed!\n");
        goto LAB_0011c105;
      }
      iVar8 = MultiByteToWideChar(0,0,(LPCSTR)lpWideCharStr,(int)__maxlen,(LPWSTR)pCVar2,
                                  (int)__maxlen);
      uVar19 = 1;
      _Count = __maxlen;
      pthrCurrent = lpWideCharStr;
      if (iVar8 == 0) {
        fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x87d);
        pFVar1 = _stderr;
        DVar9 = GetLastError();
        fprintf(pFVar1,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar9);
LAB_0011c105:
        CorUnix::InternalFree(lpWideCharStr);
LAB_0011bffd:
        iVar17 = -1;
LAB_0011c00e:
        if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
          __stack_chk_fail();
        }
        return iVar17;
      }
    }
    else {
      lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar6 + 1));
      pCVar2 = local_468;
      Buffer = local_478;
      if (lpWideCharStr == (CPalThread *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011c1eb;
        piVar15 = __errno_location();
        *piVar15 = 8;
        goto LAB_0011bffd;
      }
      eVar7 = strncpy_s((char *)lpWideCharStr,(long)(int)(uVar6 + 1),(char *)local_468,_Count);
      if (eVar7 != 0) {
        fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x892);
        fprintf(_stderr,"strncpy_s failed!\n");
        goto LAB_0011c105;
      }
      uVar19 = 0;
      local_470 = lpWideCharStr;
      iVar8 = MultiByteToWideChar(0,0,(LPCSTR)lpWideCharStr,uVar6,(LPWSTR)pCVar2,uVar6);
      pthrCurrent = local_470;
      if (iVar8 == 0) {
        fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x89f);
        pFVar1 = _stderr;
        DVar9 = GetLastError();
        fprintf(pFVar1,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar9);
        lpWideCharStr = local_470;
        goto LAB_0011c105;
      }
    }
    _Type = (CPalThread *)
            ((long)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset + _Count * 2);
    CorUnix::InternalFree(pthrCurrent);
    Count = sStack_480;
  } while( true );
  while (uVar19 = uVar19 + 1, uVar3 = uVar19, (int)uVar19 <= (int)uVar6) {
LAB_0011be4f:
    uVar19 = uVar3;
    if (*(short *)((long)&lpWideCharStr->_vptr_CPalThread + (long)(int)uVar19 * 2) == 0) break;
  }
LAB_0011be6e:
  pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar19 + 1) * 2);
  if (pthrCurrent == (CPalThread *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011c1eb;
    piVar15 = __errno_location();
    *piVar15 = 8;
    if ((char)local_468 != '\0') goto LAB_0011bffd;
    goto LAB_0011c105;
  }
  if (uVar6 == 0xfffffffd) {
    *(undefined2 *)&pthrCurrent->_vptr_CPalThread = 0;
    uVar19 = 0;
  }
  else if (((int)uVar6 < 1) || ((int)uVar19 <= (int)uVar6)) {
    PAL_wcscpy((char16_t *)pthrCurrent,(char16_t *)lpWideCharStr);
  }
  else {
    eVar7 = wcsncpy_s((char16_t_conflict *)pthrCurrent,(long)(int)(uVar19 + 1),
                      (char16_t_conflict *)lpWideCharStr,(ulong)uVar6);
    uVar19 = uVar6;
    if (eVar7 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011c1eb;
      if ((char)local_468 == '\0') {
        CorUnix::InternalFree(lpWideCharStr);
      }
      CorUnix::InternalFree(pthrCurrent);
LAB_0011c1db:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011c1eb;
      goto LAB_0011bffd;
    }
  }
  uVar19 = Internal_AddPaddingW
                     ((LPWSTR *)&Type,(int)sStack_480 - (int)((ulong)local_470 >> 1),
                      (LPWSTR)pthrCurrent,local_4ac - uVar19,BufferPtr._4_4_);
  if ((char)local_468 == '\0') {
    CorUnix::InternalFree(lpWideCharStr);
  }
  uVar19 = uVar19 ^ 1;
  CorUnix::InternalFree(pthrCurrent);
  Count = sStack_480;
  Buffer = local_478;
  goto LAB_0011b739;
}

Assistant:

int CoreWvsnprintf(CPalThread *pthrCurrent, LPWSTR Buffer, size_t Count, LPCWSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPWSTR BufferPtr = Buffer;
    LPCWSTR Fmt = Format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    LPSTR TempNumberBuffer;
    int mbtowcResult;
    va_list(ap);

    PERF_ENTRY(wvsnprintf);
    ENTRY("wvsnprintf (buffer=%p, count=%u, format=%p (%S))\n",
          Buffer, Count, Format, Format);

    va_copy(ap, aparg);
    BOOL precisionSet = false;

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                (Prefix == PFF_PREFIX_SHORT && Type == PFF_TYPE_STRING) ||
                (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                BOOL needToFree = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                    precisionSet = true;
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if ((Type == PFF_TYPE_STRING && Prefix == PFF_PREFIX_LONG) ||
                    Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    // %lS and %hs assume an LPSTR argument.
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc((Length + 1 ) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            needToFree = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = 0;
                if (precisionSet)
                {
                    for(; Length <= Precision && TempWStr[Length] != 0; Length++);
                }
                else
                {
                    Length = PAL_wcslen(TempWStr);
                }

                WorkingWStr = (LPWSTR) InternalMalloc(sizeof(WCHAR) * (Length + 1));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (needToFree)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    // Copy nothing
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision) != SAFECRT_SUCCESS)
                    {
                        ERROR("CoreWvsnprintf failed\n");
                        if (needToFree)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(wvsnprintf);
                        va_end(ap);
                        return (-1);
                    }
                    Length = Precision;
                }
                else
                {
                    // Copy everything
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }

                // Add padding if needed.
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   WorkingWStr,
                                                   Width - Length,
                                                   Flags);

                if (needToFree)
                {
                    InternalFree(TempWStr);
                }
                InternalFree(WorkingWStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempWChar,
                                                   Width - 1,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else
            {
                // Types that sprintf can handle

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */
                size_t TempCount = Count - (BufferPtr - Buffer);
                TempInt = 0;

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf((LPSTR) BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt == 0)
                {
                    // The argument is "".
                    continue;
                }
                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempCount+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        errno = ENOMEM;
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempCount+1, (LPSTR) BufferPtr, TempCount) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempCount,
                                                       BufferPtr, TempCount);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempInt+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempInt+1, (LPSTR) BufferPtr, TempInt) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempInt,
                                                       BufferPtr, TempInt);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempInt;
                }
                InternalFree(TempNumberBuffer);
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}